

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QString * __thiscall QAuthenticator::password(QAuthenticator *this)

{
  long *in_RSI;
  QString *in_RDI;
  
  if (*in_RSI == 0) {
    QString::QString((QString *)0x20522e);
  }
  else {
    QString::QString(in_RDI,in_RDI);
  }
  return in_RDI;
}

Assistant:

QString QAuthenticator::password() const
{
    return d ? d->password : QString();
}